

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

int VSC_Scroll_Line_Forward(FORM *form)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = form->toprow;
  iVar3 = form->current->drows - (int)form->current->rows;
  iVar4 = iVar3 - iVar1;
  iVar2 = 1;
  if (iVar4 == 0 || iVar3 < iVar1) {
    iVar2 = iVar4;
  }
  if (0 < iVar2) {
    form->currow = form->currow + iVar2;
    form->toprow = iVar1 + iVar2;
    return 0;
  }
  return -0xc;
}

Assistant:

static int VSC_Generic(FORM *form, int lines)
{
  FIELD *field = form->current;
  int res = E_REQUEST_DENIED;
  int rows_to_go = (lines > 0 ? lines : -lines);

  if (lines > 0)
    {
      if ( (rows_to_go + form->toprow) > (field->drows - field->rows) )
        rows_to_go = (field->drows - field->rows - form->toprow);

      if (rows_to_go > 0)
        {
          form->currow += rows_to_go;
          form->toprow += rows_to_go;
          res = E_OK;
        }
    }
  else
    {
      if (rows_to_go > form->toprow)
        rows_to_go = form->toprow;
      
      if (rows_to_go > 0)
        {
          form->currow -= rows_to_go;
          form->toprow -= rows_to_go;
          res = E_OK;
        }
    }
  return(res);
}